

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_style_push_font(nk_context *ctx,nk_user_font *font)

{
  int iVar1;
  nk_bool nVar2;
  long lVar3;
  
  nVar2 = 0;
  if (ctx != (nk_context *)0x0) {
    iVar1 = (ctx->stacks).fonts.head;
    lVar3 = (long)iVar1;
    if (lVar3 < 8) {
      (ctx->stacks).fonts.head = iVar1 + 1;
      (ctx->stacks).fonts.elements[lVar3].address = &(ctx->style).font;
      (ctx->stacks).fonts.elements[lVar3].old_value = (ctx->style).font;
      (ctx->style).font = font;
      nVar2 = 1;
    }
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_style_push_font(struct nk_context *ctx, const struct nk_user_font *font)
{
struct nk_config_stack_user_font *font_stack;
struct nk_config_stack_user_font_element *element;

NK_ASSERT(ctx);
if (!ctx) return 0;

font_stack = &ctx->stacks.fonts;
NK_ASSERT(font_stack->head < (int)NK_LEN(font_stack->elements));
if (font_stack->head >= (int)NK_LEN(font_stack->elements))
return 0;

element = &font_stack->elements[font_stack->head++];
element->address = &ctx->style.font;
element->old_value = ctx->style.font;
ctx->style.font = font;
return 1;
}